

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExportDirWrapper.cpp
# Opt level: O2

QString * __thiscall
ExportDirWrapper::getName(QString *__return_storage_ptr__,ExportDirWrapper *this)

{
  QString libName;
  QArrayDataPointer<char16_t> local_40;
  QArrayDataPointer<char16_t> local_28;
  
  QString::QString(__return_storage_ptr__,"Export");
  (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
    super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x31])(&local_40,this)
  ;
  if (-1 < local_40.size) {
    operator+((QString *)&local_28,": ",(QString *)&local_40);
    QString::append((QString *)__return_storage_ptr__);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  return __return_storage_ptr__;
}

Assistant:

QString ExportDirWrapper::getName()
{
    QString infoName = "Export";
    QString libName = this->getLibraryName();
    if (libName.length() >= 0) {
        infoName += ": "+ libName;
    }
    return infoName;
}